

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

hash_entry_t * lookup(hash_table_t *h,uint32 hash,char *key,size_t len)

{
  size_t sVar1;
  int32 iVar2;
  size_t sVar3;
  hash_entry_s *entry;
  
  if (h->table[hash].key != (char *)0x0) {
    entry = h->table + hash;
    if (h->nocase == 0) {
      do {
        sVar1 = entry->len;
        if (sVar1 == len) {
          if (sVar1 == 0) {
            return entry;
          }
          sVar3 = 0;
          while (entry->key[sVar3] == key[sVar3]) {
            sVar3 = sVar3 + 1;
            if (sVar1 == sVar3) {
              return entry;
            }
          }
        }
        entry = entry->next;
      } while (entry != (hash_entry_s *)0x0);
    }
    else {
      do {
        if ((entry->len == len) && (iVar2 = keycmp_nocase(entry,key), iVar2 == 0)) {
          return entry;
        }
        entry = entry->next;
      } while (entry != (hash_entry_s *)0x0);
    }
  }
  return (hash_entry_t *)0x0;
}

Assistant:

static hash_entry_t *
lookup(hash_table_t * h, uint32 hash, const char *key, size_t len)
{
    hash_entry_t *entry;

    entry = &(h->table[hash]);
    if (entry->key == NULL)
        return NULL;

    if (h->nocase) {
        while (entry && ((entry->len != len)
                         || (keycmp_nocase(entry, key) != 0)))
            entry = entry->next;
    }
    else {
        while (entry && ((entry->len != len)
                         || (keycmp_case(entry, key) != 0)))
            entry = entry->next;
    }

    return entry;
}